

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O3

MPP_RET mpp_service_ioc_detach_fd(MppDevBufMapNode *node)

{
  uint __errnum;
  MPP_RET MVar1;
  uint *puVar2;
  char *pcVar3;
  RK_S32 fd;
  RK_S32 local_3c [5];
  RK_S32 *local_28;
  
  local_3c[0] = node->buf_fd;
  local_28 = local_3c;
  local_3c[1] = 0x402;
  local_3c[2] = 2;
  local_3c[3] = 4;
  local_3c[4] = 0;
  MVar1 = ioctl(node->dev_fd,0x40047601);
  if (MVar1 != MPP_OK) {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    _mpp_log_l(2,"mpp_serivce","failed ret %d errno %d %s\n","mpp_service_ioc_detach_fd",
               (ulong)(uint)MVar1,(ulong)__errnum,pcVar3);
  }
  node->iova = 0xffffffff;
  return MVar1;
}

Assistant:

static MPP_RET mpp_service_ioc_detach_fd(MppDevBufMapNode *node)
{
    RK_S32 fd = node->buf_fd;
    MppReqV1 mpp_req;
    MPP_RET ret;

    mpp_req.cmd = MPP_CMD_RELEASE_FD;
    mpp_req.flag = MPP_FLAGS_LAST_MSG;
    mpp_req.size = sizeof(RK_U32);
    mpp_req.offset = 0;
    mpp_req.data_ptr = REQ_DATA_PTR(&fd);

    ret = mpp_service_ioctl_request(node->dev_fd, &mpp_req);
    if (ret) {
        mpp_err_f("failed ret %d errno %d %s\n", ret, errno, strerror(errno));
    }
    node->iova = (RK_U32)(-1);
    return ret;
}